

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alteration_notifier.h
# Opt level: O1

void __thiscall
lemon::
AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>::
add(AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>
    *this,Item *item)

{
  Observers *pOVar1;
  _List_node_base **pp_Var2;
  _List_node_base *p_Var3;
  iterator jt;
  _List_node_base *p_Var4;
  
  pOVar1 = &this->_observers;
  p_Var4 = (_List_node_base *)pOVar1;
  if ((_List_node_base *)pOVar1 !=
      (this->_observers).
      super__List_base<lemon::AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>::ObserverBase_*,_std::allocator<lemon::AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>::ObserverBase_*>_>
      ._M_impl._M_node.super__List_node_base._M_next) {
    do {
      p_Var3 = p_Var4->_M_prev[1]._M_next;
      (*(code *)p_Var3->_M_next[1]._M_next)(p_Var3,item);
      pp_Var2 = &p_Var4->_M_prev;
      p_Var4 = *pp_Var2;
    } while (*pp_Var2 !=
             (pOVar1->
             super__List_base<lemon::AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>::ObserverBase_*,_std::allocator<lemon::AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>::ObserverBase_*>_>
             )._M_impl._M_node.super__List_node_base._M_next);
  }
  return;
}

Assistant:

void add(const Item& item) {
    typename Observers::reverse_iterator it;
    try {
      for (it = _observers.rbegin(); it != _observers.rend(); ++it) {
        (*it)->add(item);
      }
    } catch (...) {
      typename Observers::iterator jt;
      for (jt = it.base(); jt != _observers.end(); ++jt) {
        (*jt)->erase(item);
      }
      throw;
    }
  }